

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.cpp
# Opt level: O0

Matrix4x4 * __thiscall CMU462::Camera::getTransformation(Camera *this)

{
  double *pdVar1;
  long in_RSI;
  Matrix4x4 *in_RDI;
  Matrix4x4 retmul;
  int y;
  int x;
  Matrix4x4 ret;
  Matrix4x4 *in_stack_00000748;
  int in_stack_fffffffffffffe28;
  int in_stack_fffffffffffffe2c;
  Matrix4x4 *in_stack_fffffffffffffe30;
  Vector3D *in_stack_fffffffffffffe58;
  Matrix4x4 *in_stack_fffffffffffffe60;
  Matrix4x4 *in_stack_fffffffffffffe68;
  Vector3D local_130 [6];
  int local_98;
  int local_94;
  
  Matrix4x4::identity();
  for (local_94 = 0; local_94 < 3; local_94 = local_94 + 1) {
    for (local_98 = 0; local_98 < 3; local_98 = local_98 + 1) {
      pdVar1 = Matrix3x3::operator()
                         ((Matrix3x3 *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c,
                          in_stack_fffffffffffffe28);
      in_stack_fffffffffffffe30 = (Matrix4x4 *)*pdVar1;
      pdVar1 = Matrix4x4::operator()
                         (in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c,
                          in_stack_fffffffffffffe28);
      *pdVar1 = (double)in_stack_fffffffffffffe30;
    }
  }
  Vector3D::Vector3D(local_130,(Vector3D *)(in_RSI + 0x28));
  Matrix4x4::translation(in_stack_fffffffffffffe58);
  Matrix4x4::operator*(in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
  Matrix4x4::inv(in_stack_00000748);
  return in_RDI;
}

Assistant:

Matrix4x4 Camera::getTransformation() {
  Matrix4x4 ret = Matrix4x4::identity();
  for(int x = 0; x < 3; ++x)
    for(int y = 0; y < 3; ++y)
      ret(x, y) = c2w(x, y);

  Matrix4x4 retmul = Matrix4x4::translation(pos);

  return (retmul * ret).inv();
}